

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

string * flatbuffers::BufferToHexText
                   (string *__return_storage_ptr__,void *buffer,size_t buffer_size,size_t max_length
                   ,string *wrapped_line_prefix,string *wrapped_line_suffix)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  bool bVar5;
  string local_60;
  string *local_40;
  size_t local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (wrapped_line_prefix->_M_dataplus)._M_p;
  local_40 = wrapped_line_prefix;
  local_38 = max_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + wrapped_line_prefix->_M_string_length)
  ;
  uVar2 = CONCAT71((int7)(max_length >> 8),buffer_size == 0 || buffer == (void *)0x0);
  if (buffer_size != 0 && buffer != (void *)0x0) {
    sVar4 = 0;
    uVar3 = 1;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IntToStringHex_abi_cxx11_
                (&local_60,(flatbuffers *)(ulong)*(byte *)((long)buffer + (uVar3 - 1)),2,(int)uVar2)
      ;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (uVar3 < buffer_size) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar2 = local_38 + sVar4;
        if (uVar2 <= __return_storage_ptr__->_M_string_length +
                     wrapped_line_suffix->_M_string_length) {
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)(wrapped_line_suffix->_M_dataplus)._M_p);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          sVar4 = __return_storage_ptr__->_M_string_length;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)(local_40->_M_dataplus)._M_p);
        }
      }
    } while ((buffer != (void *)0x0) && (bVar5 = uVar3 < buffer_size, uVar3 = uVar3 + 1, bVar5));
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(wrapped_line_suffix->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

inline std::string BufferToHexText(const void *buffer, size_t buffer_size,
                                   size_t max_length,
                                   const std::string &wrapped_line_prefix,
                                   const std::string &wrapped_line_suffix) {
  std::string text = wrapped_line_prefix;
  size_t start_offset = 0;
  const char *s = reinterpret_cast<const char *>(buffer);
  for (size_t i = 0; s && i < buffer_size; i++) {
    // Last iteration or do we have more?
    bool have_more = i + 1 < buffer_size;
    text += "0x";
    text += IntToStringHex(static_cast<uint8_t>(s[i]), 2);
    if (have_more) { text += ','; }
    // If we have more to process and we reached max_length
    if (have_more &&
        text.size() + wrapped_line_suffix.size() >= start_offset + max_length) {
      text += wrapped_line_suffix;
      text += '\n';
      start_offset = text.size();
      text += wrapped_line_prefix;
    }
  }
  text += wrapped_line_suffix;
  return text;
}